

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Throw * __thiscall
wasm::Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name tag,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Throw *this_00;
  MixedArena *this_01;
  
  this_01 = &this->wasm->allocator;
  this_00 = (Throw *)MixedArena::allocSpace(this_01,0x40,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression._id = ThrowId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression.type.id = 0;
  (this_00->tag).super_IString.str._M_len = 0;
  (this_00->tag).super_IString.str._M_str = (char *)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->operands).allocator = this_01;
  (this_00->tag).super_IString.str._M_len = tag.super_IString.str._M_len;
  (this_00->tag).super_IString.str._M_str = tag.super_IString.str._M_str;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,args);
  Throw::finalize(this_00);
  return this_00;
}

Assistant:

Throw* makeThrow(Name tag, const T& args) {
    auto* ret = wasm.allocator.alloc<Throw>();
    ret->tag = tag;
    ret->operands.set(args);
    ret->finalize();
    return ret;
  }